

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall amrex::EB2::Level::fillCentroid(Level *this,MultiFab *centroid,Geometry *geom)

{
  bool bVar1;
  undefined8 in_RDX;
  FabArray<amrex::FArrayBox> *in_RSI;
  Level *in_RDI;
  Periodicity PVar2;
  int in_stack_00000010;
  Periodicity *in_stack_00000018;
  CpOp in_stack_00000020;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff90;
  undefined4 local_30;
  Level *this_00;
  
  this_00 = in_RDI;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (in_stack_ffffffffffffff90,
             (value_type)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = isAllRegular(in_RDI);
  if (!bVar1) {
    FabArrayBase::nGrow(&in_RSI->super_FabArrayBase,0);
    PVar2 = Geometry::periodicity(&in_RDI->m_geom);
    local_30 = PVar2.period.vect[2];
    FabArray<amrex::FArrayBox>::ParallelCopy
              ((FabArray<amrex::FArrayBox> *)this_00,in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX
               ,local_30,PVar2.period.vect[1],in_stack_00000010,in_stack_00000018,in_stack_00000020)
    ;
  }
  return;
}

Assistant:

void
Level::fillCentroid (MultiFab& centroid, const Geometry& geom) const
{
    centroid.setVal(0.0);
    if (!isAllRegular()) {
        centroid.ParallelCopy(m_centroid,0,0,AMREX_SPACEDIM,0,centroid.nGrow(),
                              geom.periodicity());
    }
}